

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxSoundCast::Resolve(FxSoundCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PSound *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  FxExpression *pFVar5;
  FScriptPosition *other;
  ExpVal constval;
  ExpVal local_48;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_00520ff2:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar3 = (*this->basex->_vptr_FxExpression[2])();
  pFVar5 = (FxExpression *)CONCAT44(extraout_var,iVar3);
  this->basex = pFVar5;
  if (pFVar5 == (FxExpression *)0x0) goto LAB_00520ff2;
  pPVar1 = pFVar5->ValueType;
  if (pPVar1 != (PType *)TypeSound) {
    pPVar4 = *(PClass **)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8);
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(*(code *)**(undefined8 **)&pPVar1->super_PTypeBase)(pPVar1);
      *(PClass **)(&((PInt *)&pPVar1->super_PTypeBase)->field_0x0 + 8) = pPVar4;
      pFVar5 = this->basex;
    }
    if (pPVar4 != PInt::RegistrationInfo.MyClass) {
      if (pFVar5->ValueType == (PType *)TypeString) {
        iVar3 = (*pFVar5->_vptr_FxExpression[3])(pFVar5);
        if ((char)iVar3 == '\0') {
          return &this->super_FxExpression;
        }
        local_48.field_1 =
             (anon_union_8_3_addc324a_for_ExpVal_1)
             ((anon_union_8_3_addc324a_for_ExpVal_1 *)(this->basex + 1))->pointer;
        other = &this->basex[1].ScriptPosition;
        if ((PString *)local_48.field_1.pointer == TypeString) {
          FString::AttachToOther(&local_38,&other->FileName);
        }
        else {
          local_38.Chars = (other->FileName).Chars;
        }
        pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        ExpVal::GetString(&local_48);
        iVar3 = S_FindSound((char *)local_48.Type);
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  (&pFVar5->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
        pFVar5->NeedResult = true;
        pFVar5->ExprType = EFX_Constant;
        pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        pPVar2 = TypeSound;
        pFVar5[1]._vptr_FxExpression = (_func_int **)TypeSound;
        pFVar5->ValueType = (PType *)pPVar2;
        *(int *)&pFVar5[1].ScriptPosition.FileName.Chars = iVar3;
        pFVar5->isresolved = true;
        FString::~FString((FString *)&local_48);
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        if ((PString *)local_48.field_1.pointer != TypeString) {
          return pFVar5;
        }
        FString::~FString(&local_38);
        return pFVar5;
      }
      pFVar5 = (FxExpression *)0x0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert to sound");
      goto LAB_00521010;
    }
  }
  pFVar5->ValueType = (PType *)TypeSound;
  this->basex = (FxExpression *)0x0;
LAB_00521010:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return pFVar5;
}

Assistant:

FxExpression *FxSoundCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeSound || basex->ValueType->GetClass() == RUNTIME_CLASS(PInt))
	{
		FxExpression *x = basex;
		x->ValueType = TypeSound;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType == TypeString)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(FSoundID(constval.GetString()), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert to sound");
		delete this;
		return nullptr;
	}
}